

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

wchar_t effect_calculate_value(effect_handler_context_t_conflict *context,_Bool use_boost)

{
  wchar_t wVar1;
  wchar_t num;
  int iVar2;
  wchar_t wVar3;
  wchar_t sides;
  
  if (set_value != L'\0') {
    return set_value;
  }
  wVar1 = (context->value).base;
  num = (context->value).dice;
  if (wVar1 < L'\x01') {
    wVar3 = L'\0';
    if ((num < L'\x01') || (sides = (context->value).sides, sides < L'\x01')) goto LAB_0013abc3;
  }
  else {
    sides = (context->value).sides;
  }
  iVar2 = damroll(num,sides);
  wVar3 = iVar2 + wVar1;
LAB_0013abc3:
  if (use_boost) {
    wVar3 = ((context->boost + 100) * wVar3) / 100;
  }
  return wVar3;
}

Assistant:

int effect_calculate_value(effect_handler_context_t *context, bool use_boost)
{
	int final = 0;

	if (set_value) {
		return set_value;
	}

	if (context->value.base > 0 ||
		(context->value.dice > 0 && context->value.sides > 0)) {
		final = context->value.base +
			damroll(context->value.dice, context->value.sides);
	}

	/* Device boost */
	if (use_boost) {
		final *= (100 + context->boost);
		final /= 100;
	}

	return final;
}